

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result wabt::ParseWastScript
                 (WastLexer *lexer,
                 unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  long lVar2;
  Enum EVar3;
  WastParser parser;
  WastParser local_108;
  
  if (out_script == (unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)0x0) {
    __assert_fail("out_script != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0xf48,
                  "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options != (WastParseOptions *)0x0) {
    local_108.last_module_index_ = 0xffffffff;
    local_108.lexer_ = lexer;
    local_108.errors_ = errors;
    local_108.options_ = options;
    memset(&local_108.resolve_types_,0,200);
    lVar2 = 0x90;
    do {
      *(undefined1 *)((long)local_108.tokens_.tokens._M_elems + lVar2 + -0x50) = 0;
      lVar2 = lVar2 + 0x48;
    } while (lVar2 != 0x120);
    local_108.tokens_.i = false;
    RVar1 = WastParser::ParseScript(&local_108,out_script);
    EVar3 = Error;
    if (RVar1.enum_ != Error) {
      RVar1 = ResolveNamesScript((out_script->_M_t).
                                 super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>
                                 .super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,errors);
      EVar3 = (Enum)(RVar1.enum_ == Error);
    }
    std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>::
    ~vector(&local_108.resolve_funcs_);
    std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>::
    ~vector(&local_108.resolve_types_);
    return (Result)EVar3;
  }
  __assert_fail("options != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0xf49,
                "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWastScript(WastLexer* lexer,
                       std::unique_ptr<Script>* out_script,
                       Errors* errors,
                       WastParseOptions* options) {
  assert(out_script != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseScript(out_script));
  CHECK_RESULT(ResolveNamesScript(out_script->get(), errors));
  return Result::Ok;
}